

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O0

void __thiscall Txid_TxidEqualsGetByte_Test::TestBody(Txid_TxidEqualsGetByte_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *message;
  char *in_R9;
  string local_f0;
  AssertHelper local_d0;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  bool local_79;
  undefined1 local_78 [7];
  bool is_equals;
  Txid txid;
  ByteData256 byte_data;
  allocator<unsigned_char> local_29;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> list1;
  Txid_TxidEqualsGetByte_Test *this_local;
  
  list1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_29);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0x20,&local_29);
  std::allocator<unsigned_char>::~allocator(&local_29);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,2);
  *pvVar2 = '\b';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,4);
  *pvVar2 = '@';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,6);
  *pvVar2 = ' ';
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)
             &txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  cfd::core::Txid::Txid
            ((Txid *)local_78,
             (ByteData256 *)
             &txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Txid::GetData((ByteData *)&gtest_ar_.message_,(Txid *)local_78);
  cfd::core::ByteData::GetBytes(&local_98,(ByteData *)&gtest_ar_.message_);
  bVar1 = std::operator==(&local_98,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_.message_);
  local_79 = bVar1;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)local_c0,(AssertionResult *)"is_equals","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_txid.cpp"
               ,0x48,message);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  cfd::core::Txid::~Txid((Txid *)local_78);
  cfd::core::ByteData256::~ByteData256
            ((ByteData256 *)
             &txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

TEST(Txid, TxidEqualsGetByte) {
  std::vector<uint8_t> list1(32);
  list1[2] = 8;
  list1[4] = 64;
  list1[6] = 32;
  ByteData256 byte_data = ByteData256(list1);
  Txid txid = Txid(byte_data);
  bool is_equals = (txid.GetData().GetBytes() == list1);
  EXPECT_TRUE(is_equals);
}